

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::StartSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
  *this_00;
  ParseNode *node_00;
  uint beginCodeSpan;
  SubexpressionNode local_28;
  ParseNode *local_18;
  ParseNode *node_local;
  ByteCodeWriter *this_local;
  
  if (((this->m_isInDebugMode & 1U) != 0) && (this->m_pMatchingNode != (ParseNode *)0x0)) {
    local_18 = node;
    node_local = (ParseNode *)this;
    EnsureLongBranch(this,StatementBoundary);
    node_00 = local_18;
    this_00 = this->m_subexpressionNodesStack;
    beginCodeSpan = Data::GetCurrentOffset(&this->m_byteCodeData);
    SubexpressionNode::SubexpressionNode(&local_28,node_00,beginCodeSpan);
    JsUtil::
    Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>::
    Push(this_00,&local_28);
  }
  return;
}

Assistant:

void ByteCodeWriter::StartSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || !m_pMatchingNode) // Subexpression not in debug mode or not enclosed in regular statement
        {
            return;
        }
#ifdef BYTECODE_BRANCH_ISLAND
        // If we are going to emit a branch island, it should be before the statement start
        this->EnsureLongBranch(Js::OpCode::StatementBoundary);
#endif
        m_subexpressionNodesStack->Push(SubexpressionNode(node, m_byteCodeData.GetCurrentOffset()));
    }